

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<Fad<double>,_10>::Resize(TPZManVector<Fad<double>,_10> *this,int64_t newsize)

{
  Fad<double> *pFVar1;
  ostream *poVar2;
  ulong *puVar3;
  int64_t i_1;
  long lVar4;
  int64_t i;
  long lVar5;
  Fad<double> *pFVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  if (-1 < newsize) {
    lVar7 = (this->super_TPZVec<Fad<double>_>).fNElements;
    if (lVar7 != newsize) {
      lVar4 = (this->super_TPZVec<Fad<double>_>).fNAlloc;
      if (lVar4 < newsize) {
        if ((ulong)newsize < 0xb) {
          pFVar1 = this->fExtAlloc;
          if ((this->super_TPZVec<Fad<double>_>).fStore != pFVar1) {
            lVar4 = 0;
            for (lVar5 = 0; pFVar6 = (this->super_TPZVec<Fad<double>_>).fStore, lVar5 < lVar7;
                lVar5 = lVar5 + 1) {
              Fad<double>::operator=
                        ((Fad<double> *)((long)&pFVar1->val_ + lVar4),
                         (Fad<double> *)((long)&pFVar6->val_ + lVar4));
              lVar7 = (this->super_TPZVec<Fad<double>_>).fNElements;
              lVar4 = lVar4 + 0x20;
            }
            if (pFVar6 != (Fad<double> *)0x0) {
              dVar9 = pFVar6[-1].defaultVal;
              if (dVar9 != 0.0) {
                lVar7 = (long)dVar9 << 5;
                do {
                  Fad<double>::~Fad((Fad<double> *)((long)&pFVar6[-1].val_ + lVar7));
                  lVar7 = lVar7 + -0x20;
                } while (lVar7 != 0);
              }
              operator_delete__(&pFVar6[-1].defaultVal,(long)dVar9 << 5 | 8);
            }
            (this->super_TPZVec<Fad<double>_>).fStore = pFVar1;
          }
          (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<double>_>).fNAlloc = 0;
        }
        else {
          dVar9 = (double)lVar4 * 1.2;
          uVar8 = (long)dVar9;
          if (dVar9 < (double)newsize) {
            uVar8 = newsize;
          }
          puVar3 = (ulong *)operator_new__(-(ulong)(uVar8 >> 0x3b != 0) | uVar8 * 0x20 | 8);
          *puVar3 = uVar8;
          pFVar1 = (Fad<double> *)(puVar3 + 1);
          if (uVar8 != 0) {
            lVar7 = 0;
            pFVar6 = pFVar1;
            do {
              Fad<double>::Fad(pFVar6);
              lVar7 = lVar7 + -0x20;
              pFVar6 = pFVar6 + 1;
            } while (-lVar7 != uVar8 * 0x20);
          }
          lVar4 = 0;
          for (lVar7 = 0; pFVar6 = (this->super_TPZVec<Fad<double>_>).fStore,
              lVar7 < (this->super_TPZVec<Fad<double>_>).fNElements; lVar7 = lVar7 + 1) {
            Fad<double>::operator=
                      ((Fad<double> *)((long)&pFVar1->val_ + lVar4),
                       (Fad<double> *)((long)&pFVar6->val_ + lVar4));
            lVar4 = lVar4 + 0x20;
          }
          if (pFVar6 != (Fad<double> *)0x0 && pFVar6 != this->fExtAlloc) {
            dVar9 = pFVar6[-1].defaultVal;
            if (dVar9 != 0.0) {
              lVar7 = (long)dVar9 << 5;
              do {
                Fad<double>::~Fad((Fad<double> *)((long)&pFVar6[-1].val_ + lVar7));
                lVar7 = lVar7 + -0x20;
              } while (lVar7 != 0);
            }
            operator_delete__(&pFVar6[-1].defaultVal,(long)dVar9 << 5 | 8);
          }
          (this->super_TPZVec<Fad<double>_>).fStore = pFVar1;
          (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<double>_>).fNAlloc = uVar8;
        }
      }
      else {
        (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}